

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall
Js::JavascriptArray::TryAddToSegmentMap
          (JavascriptArray *this,Recycler *recycler,SparseArraySegmentBase *seg)

{
  SegmentBTreeRoot *this_00;
  
  this_00 = GetSegmentMap(this);
  if (this_00 != (SegmentBTreeRoot *)0x0) {
    ClearSegmentMap(this);
    SegmentBTreeRoot::Add(this_00,recycler,seg);
    SetSegmentMap(this,this_00);
    return;
  }
  return;
}

Assistant:

void JavascriptArray::TryAddToSegmentMap(Recycler* recycler, SparseArraySegmentBase* seg)
    {
        SegmentBTreeRoot * savedSegmentMap = GetSegmentMap();
        if (savedSegmentMap)
        {
            //
            // We could OOM and throw when adding to segmentMap, resulting in a corrupted segmentMap on this
            // array. Set segmentMap to null temporarily to protect from this. It will be restored correctly
            // if adding segment succeeds.
            //
            ClearSegmentMap();
            savedSegmentMap->Add(recycler, seg);
            SetSegmentMap(savedSegmentMap);
        }
    }